

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::computeOptimizationHints(SchemaLoader *this)

{
  Own<capnp::SchemaLoader::Impl,_std::nullptr_t> *this_00;
  Impl *this_01;
  SchemaLoader *local_10;
  SchemaLoader *this_local;
  
  local_10 = this;
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffe0,this);
  this_00 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::operator->
                      ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)
                       &stack0xffffffffffffffe0);
  this_01 = kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::get(this_00);
  Impl::computeOptimizationHints(this_01);
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)&stack0xffffffffffffffe0
            );
  return;
}

Assistant:

void SchemaLoader::computeOptimizationHints() {
  impl.lockExclusive()->get()->computeOptimizationHints();
}